

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

wal_item * wal_itr_next(wal_iterator *wal_itr)

{
  avl_node *paVar1;
  long in_RDI;
  wal_item *unaff_retaddr;
  wal_iterator *in_stack_00000008;
  wal_item *result;
  wal_iterator *in_stack_00000028;
  wal_iterator *in_stack_00000038;
  wal_item *local_28;
  wal_item *local_20;
  wal_item *local_18;
  wal_item *local_8;
  
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0x33) & 1) == 0) {
    if (*(long *)(*(long *)(in_RDI + 8) + 0x20) == 0) {
      local_8 = (wal_item *)0x0;
    }
    else {
      if (*(char *)(in_RDI + 0x22) == '\x01') {
        if (*(long *)(in_RDI + 0x38) == 0) {
          return (wal_item *)0x0;
        }
        if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
          local_18 = _wal_itr_next_byseq(in_stack_00000028);
        }
        else {
          local_18 = _wal_itr_next_bykey(in_stack_00000038);
        }
      }
      else {
        if (*(long *)(in_RDI + 0x40) == 0) {
          return (wal_item *)0x0;
        }
        if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
          local_18 = _wal_itr_search_greater_byseq(in_stack_00000008,unaff_retaddr);
        }
        else {
          local_18 = _wal_itr_search_greater_bykey(in_stack_00000008,unaff_retaddr);
        }
      }
      *(undefined1 *)(in_RDI + 0x22) = 1;
      local_8 = local_18;
    }
  }
  else {
    paVar1 = avl_next(*(avl_node **)(in_RDI + 0x38));
    *(avl_node **)(in_RDI + 0x38) = paVar1;
    if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
      if (*(long *)(in_RDI + 0x38) == 0) {
        local_28 = (wal_item *)0x0;
      }
      else {
        local_28 = (wal_item *)(*(long *)(in_RDI + 0x38) + -0x10);
      }
      local_8 = local_28;
    }
    else {
      if (*(long *)(in_RDI + 0x38) == 0) {
        local_20 = (wal_item *)0x0;
      }
      else {
        local_20 = (wal_item *)(*(long *)(in_RDI + 0x38) + -0x68);
      }
      local_8 = local_20;
    }
  }
  return local_8;
}

Assistant:

struct wal_item* wal_itr_next(struct wal_iterator *wal_itr)
{
    struct wal_item *result = NULL;
    if (wal_itr->shandle->is_persisted_snapshot) {
        wal_itr->cursor_pos = avl_next(wal_itr->cursor_pos);
        if (wal_itr->by_key) {
            return wal_itr->cursor_pos ? _get_entry(wal_itr->cursor_pos,
                                                struct wal_item, avl_keysnap) : NULL;
        } else {
            return wal_itr->cursor_pos ? _get_entry(wal_itr->cursor_pos,
                                                struct wal_item, avl_seq) : NULL;
        }
    }

    if (!wal_itr->shandle->snap_tag_idx) { // no items in WAL in snapshot..
        return NULL;
    }
    if (wal_itr->direction == FDB_ITR_FORWARD) {
        if (!wal_itr->cursor_pos) {
            return result;
        }
        if (wal_itr->by_key) {
            result = _wal_itr_next_bykey(wal_itr);
        } else {
            result = _wal_itr_next_byseq(wal_itr);
        }
    } else { // change of direction involves searching across all shards..
        if (!wal_itr->item_prev) {
            return result;
        }
        if (wal_itr->by_key) {
            result = _wal_itr_search_greater_bykey(wal_itr,
                                                   wal_itr->item_prev);
        } else {
            result = _wal_itr_search_greater_byseq(wal_itr,
                                                   wal_itr->item_prev);
        }
    }
    wal_itr->direction = FDB_ITR_FORWARD;
    return result;
}